

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void Catch::Colour::use(Code _colourCode)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  IMutableContext *pIVar4;
  undefined4 extraout_var;
  undefined **ppuVar6;
  char *pcVar7;
  long *plVar5;
  
  if (use(Catch::Colour::Code)::impl != '\0') goto LAB_001a92ce;
  iVar1 = __cxa_guard_acquire(&use(Catch::Colour::Code)::impl);
  if (iVar1 == 0) goto LAB_001a92ce;
  piVar3 = __errno_location();
  iVar1 = *piVar3;
  pIVar4 = getCurrentMutableContext();
  iVar2 = (*(pIVar4->super_IContext)._vptr_IContext[4])(pIVar4);
  plVar5 = (long *)CONCAT44(extraout_var,iVar2);
  if (plVar5 == (long *)0x0) {
LAB_001a9338:
    iVar2 = isatty(1);
    if (iVar2 != 0) goto LAB_001a9344;
LAB_001a9357:
    if ((anonymous_namespace)::NoColourImpl::instance()::s_instance == '\0') {
      pcVar7 = &(anonymous_namespace)::NoColourImpl::instance()::s_instance;
      iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::NoColourImpl::instance()::s_instance);
      ppuVar6 = &(anonymous_namespace)::NoColourImpl::instance()::s_instance;
      goto LAB_001a93b1;
    }
    ppuVar6 = &(anonymous_namespace)::NoColourImpl::instance()::s_instance;
  }
  else {
    iVar2 = (**(code **)(*plVar5 + 0x90))(plVar5);
    if (iVar2 != 1) {
      if (iVar2 == 0) goto LAB_001a9338;
      goto LAB_001a9357;
    }
LAB_001a9344:
    if ((anonymous_namespace)::PosixColourImpl::instance()::s_instance == '\0') {
      pcVar7 = &(anonymous_namespace)::PosixColourImpl::instance()::s_instance;
      iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::PosixColourImpl::instance()::s_instance);
      ppuVar6 = (undefined **)&(anonymous_namespace)::PosixColourImpl::instance()::s_instance;
LAB_001a93b1:
      if (iVar2 != 0) {
        __cxa_guard_release(pcVar7);
      }
    }
    else {
      ppuVar6 = (undefined **)&(anonymous_namespace)::PosixColourImpl::instance()::s_instance;
    }
  }
  *piVar3 = iVar1;
  use::impl = (IColourImpl *)ppuVar6;
  __cxa_guard_release(&use(Catch::Colour::Code)::impl);
LAB_001a92ce:
  if (use::impl != (IColourImpl *)0x0) {
    (**(code **)(*(long *)use::impl + 0x10))(use::impl,_colourCode);
    return;
  }
  return;
}

Assistant:

void Colour::use(Code _colourCode) {
        static IColourImpl *impl = platformColourInstance();
        // Strictly speaking, this cannot possibly happen.
        // However, under some conditions it does happen (see #1626),
        // and this change is small enough that we can let practicality
        // triumph over purity in this case.
        if (impl != nullptr) {
            impl->use(_colourCode);
        }
    }